

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O0

xr_image * load<xray_re::xr_image>(char *path,char *name,bool required)

{
  bool bVar1;
  xr_file_system *this;
  xr_image *image;
  xr_file_system *fs;
  bool required_local;
  char *name_local;
  char *path_local;
  
  this = xray_re::xr_file_system::instance();
  bVar1 = xray_re::xr_file_system::file_exist(this,path,name);
  if (bVar1) {
    xray_re::msg("loading %s",name);
    path_local = (char *)operator_new(0x18);
    xray_re::xr_image::xr_image((xr_image *)path_local);
    bVar1 = xray_re::xr_image::load_dds((xr_image *)path_local,path,name);
    if (!bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level.cxx"
                    ,0x90,"xr_image *load(const char *, const char *, bool)");
    }
  }
  else {
    path_local = (char *)0x0;
  }
  return (xr_image *)path_local;
}

Assistant:

xr_image* load(const char* path, const char* name, bool required)
{
	xr_file_system& fs = xr_file_system::instance();
	if (fs.file_exist(path, name)) {
		msg("loading %s", name);
		xr_image* image = new xr_image;
		if (!image->load_dds(path, name))
			xr_not_expected();
		return image;
	}
	return 0;
}